

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

ll_node * cli_parse_args(int argc,char **argv,char *prefix)

{
  int iVar1;
  ll_node *plVar2;
  size_t sVar3;
  ll_node *plVar4;
  ll_node *plVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  char **ppcVar9;
  char *local_40;
  ll_node *local_38;
  
  if (argc < 2 || argv == (char **)0x0) {
    plVar5 = (ll_node *)0x0;
  }
  else {
    uVar6 = 1;
    plVar5 = (ll_node *)0x0;
    plVar2 = (ll_node *)0x0;
    do {
      if (prefix == (char *)0x0) {
        return plVar5;
      }
      if ((int)uVar6 < 0) {
        return plVar5;
      }
      pcVar8 = argv[uVar6];
      iVar1 = starts_with(prefix,pcVar8);
      if (iVar1 == 0) {
        pcVar8 = (char *)0x0;
      }
      uVar7 = (uVar6 + 1) - (uint)(pcVar8 == (char *)0x0);
      local_40 = pcVar8;
      if ((int)uVar7 < argc) {
        ppcVar9 = argv + (((ulong)uVar6 + 1) - (ulong)(pcVar8 == (char *)0x0));
        plVar4 = (ll_node *)0x0;
        do {
          pcVar8 = *ppcVar9;
          iVar1 = starts_with(prefix,pcVar8);
          uVar6 = uVar7;
          if (iVar1 != 0) break;
          sVar3 = strlen(pcVar8);
          if (plVar4 == (ll_node *)0x0) {
            plVar4 = ll_create_node(pcVar8,sVar3 + 1);
          }
          else {
            ll_append(plVar4,pcVar8,sVar3 + 1);
          }
          uVar7 = uVar7 + 1;
          ppcVar9 = ppcVar9 + 1;
          uVar6 = argc;
        } while ((int)uVar7 < argc);
      }
      else {
        plVar4 = (ll_node *)0x0;
        uVar6 = uVar7;
      }
      local_38 = plVar4;
      plVar4 = ll_create_node(&local_40,0x10);
      if (plVar4 == (ll_node *)0x0) {
        return plVar5;
      }
      if (plVar5 == (ll_node *)0x0) {
        plVar5 = plVar4;
      }
      if (plVar2 != (ll_node *)0x0) {
        plVar2->next = plVar4;
      }
      plVar2 = plVar4;
    } while ((int)uVar6 < argc);
  }
  return plVar5;
}

Assistant:

struct ll_node *cli_parse_args(int argc, const char *argv[], const char *prefix)
{
	int pos = 1;
	int end = pos;
	struct ll_node *root_node = NULL;
	struct ll_node *prev_node = NULL;
	struct ll_node *cur_node = NULL;

	if (argc <= 0 || argv == NULL) {
		return NULL;
	}
	while (pos < argc) {
		prev_node = cur_node;
		cur_node = parse_arg_range(pos, argc, &end, argv, prefix);
		if (cur_node == NULL) {
			break;
		}
		if (root_node == NULL) {
			root_node = cur_node;
		}
		if (prev_node != NULL) {
			prev_node->next = cur_node;
		}
		pos = end;
	}
	return root_node;
}